

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl,uint update_hs_digest)

{
  int *piVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uchar *puVar6;
  int *piVar7;
  ulong uVar8;
  uint8_t uVar9;
  ushort uVar10;
  undefined8 uVar11;
  long lVar12;
  uint uVar13;
  size_t alloc_len;
  size_t __n;
  mbedtls_ssl_hs_buffer *pmVar14;
  size_t sVar15;
  char *pcVar16;
  mbedtls_ssl_handshake_params *pmVar17;
  char *pcVar18;
  uint uVar19;
  byte bVar20;
  uint uVar21;
  bool bVar22;
  char *in_stack_ffffffffffffff48;
  undefined4 uVar23;
  ulong in_stack_ffffffffffffff50;
  mbedtls_record local_88;
  mbedtls_ssl_hs_buffer *local_58;
  uchar *local_50;
  char *local_48;
  mbedtls_ssl_handshake_params *local_40;
  char *local_38;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x101a,"=> read record");
  if (ssl->keep_current_message == 0) {
LAB_001878d3:
    do {
      while( true ) {
        iVar3 = 1;
        uVar8 = ssl->in_hslen;
        if (uVar8 == 0) break;
        if (ssl->in_offt != (uchar *)0x0) {
          iVar3 = 0x11de;
          goto LAB_00188990;
        }
        __n = ssl->in_msglen - uVar8;
        if (ssl->in_msglen < uVar8 || __n == 0) {
          ssl->in_msglen = 0;
        }
        else {
          ssl->in_msglen = __n;
          memmove(ssl->in_msg,ssl->in_msg + uVar8,__n);
          in_stack_ffffffffffffff48 = (char *)ssl->in_msglen;
          mbedtls_debug_print_buf
                    (ssl,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x11fd,"remaining content in record",ssl->in_msg,
                     (size_t)in_stack_ffffffffffffff48);
        }
        ssl->in_hslen = 0;
LAB_00187961:
        if (ssl->in_msglen == 0) goto LAB_00187a19;
LAB_0018796f:
        iVar3 = mbedtls_ssl_handle_message_type(ssl);
        if ((iVar3 != -0x6680) && (iVar3 != -0x6580)) {
          if (iVar3 != -0x6480) {
            if (iVar3 == 0) {
              if (((update_hs_digest != 1) || (ssl->in_msgtype != 0x16)) ||
                 (iVar3 = mbedtls_ssl_update_handshake_status(ssl), iVar3 == 0)) goto LAB_00187885;
              pcVar18 = "mbedtls_ssl_update_handshake_status";
              iVar4 = 0x1059;
            }
            else {
              pcVar18 = "mbedtls_ssl_handle_message_type";
              iVar4 = 0x1051;
            }
            goto LAB_00188a95;
          }
          if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
            iVar3 = 0;
            uVar11 = 0x1101;
            local_40 = ssl->handshake;
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1101,"=> ssl_buffer_message");
            if (ssl->in_msgtype == 0x16) {
              uVar10 = *(ushort *)(ssl->in_msg + 4) << 8 | *(ushort *)(ssl->in_msg + 4) >> 8;
              uVar19 = ssl->handshake->in_msg_seq;
              uVar13 = (uint)uVar10;
              uVar21 = uVar13 - uVar19;
              if (uVar13 < uVar19) {
                iVar3 = 0x1114;
LAB_00188990:
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,iVar3,"should never happen");
                return -0x6c00;
              }
              local_50 = (uchar *)CONCAT44(local_50._4_4_,
                                           (int)CONCAT71((int7)((ulong)ssl->handshake >> 8),1));
              uVar23 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
              if (3 < uVar21) {
                in_stack_ffffffffffffff50 =
                     CONCAT44((int)(in_stack_ffffffffffffff50 >> 0x20),uVar19 + 3);
                in_stack_ffffffffffffff48 = (char *)CONCAT44(uVar23,uVar19);
                iVar3 = 0;
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x1120,
                           "Ignore future HS message with sequence number %u, buffering window %u - %u"
                           ,(ulong)(uint)uVar10,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50)
                ;
                goto LAB_00187b80;
              }
              pcVar18 = (char *)ssl->in_hslen;
              local_48 = pcVar18 + -0xc;
              in_stack_ffffffffffffff48 = (char *)CONCAT44(uVar23,uVar21);
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1126,"Buffering HS message with sequence number %u, offset %u ",
                         (ulong)uVar13,in_stack_ffffffffffffff48);
              pmVar14 = (local_40->buffering).hs + uVar21;
              bVar20 = *(byte *)pmVar14;
              if ((bVar20 & 1) != 0) {
                piVar7 = (int *)(local_40->buffering).hs[uVar21].data;
                if (*piVar7 != *(int *)ssl->in_msg) {
                  iVar3 = 0;
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                             ,0x118b,"Fragment header mismatch - ignore");
                  goto LAB_00187b80;
                }
LAB_0018871d:
                if ((bVar20 & 4) != 0) goto LAB_00187b80;
                local_58 = pmVar14;
                uVar5 = ssl_get_hs_frag_off(ssl);
                local_40 = (mbedtls_ssl_handshake_params *)(ulong)uVar5;
                uVar5 = ssl_get_hs_frag_len(ssl);
                pmVar17 = local_40;
                pcVar16 = (char *)(ulong)uVar5;
                in_stack_ffffffffffffff48 = pcVar16;
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x11a0,"adding fragment, offset = %zu, length = %zu",local_40,pcVar16);
                local_38 = pcVar16;
                memcpy((void *)((long)piVar7 + (long)pmVar17 + 0xc),ssl->in_msg + 0xc,
                       (size_t)pcVar16);
                if ((*(byte *)local_58 & 2) != 0) {
                  uVar19 = (uint)pmVar17 & 7;
                  pcVar16 = local_38;
                  if (((ulong)pmVar17 & 7) == 0) {
LAB_00188843:
                    if (((ulong)pcVar16 & 7) != 0) {
                      uVar8 = (ulong)((long)pmVar17->received_sig_algs + (long)(pcVar16 + -0x38)) >>
                              3;
                      bVar20 = *(byte *)((long)piVar7 + (long)(pcVar18 + uVar8));
                      for (iVar3 = 8 - ((uint)pcVar16 & 7); iVar3 != 8; iVar3 = iVar3 + 1) {
                        bVar20 = bVar20 | (byte)(1 << ((byte)iVar3 & 0x1f));
                      }
                      *(byte *)((long)piVar7 + (long)(pcVar18 + uVar8)) = bVar20;
                    }
                    memset((char *)((long)piVar7 + (long)(pcVar18 + ((ulong)pmVar17 >> 3))),0xff,
                           (ulong)pcVar16 >> 3);
                  }
                  else {
                    uVar13 = 8 - uVar19;
                    uVar8 = (ulong)pmVar17 >> 3 & 0x1fffffff;
                    uVar21 = (uint)local_38;
                    if (uVar13 < uVar21) {
                      bVar20 = *(byte *)((long)piVar7 + (long)(pcVar18 + uVar8));
                      for (uVar19 = uVar19 ^ 7; uVar19 != 0xffffffff; uVar19 = uVar19 - 1) {
                        bVar20 = bVar20 | (byte)(1 << ((byte)uVar19 & 0x1f));
                      }
                      pmVar17 = (mbedtls_ssl_handshake_params *)
                                ((long)pmVar17->received_sig_algs + ((ulong)uVar13 - 0x38));
                      pcVar16 = local_38 + -(ulong)uVar13;
                      *(byte *)((long)piVar7 + (long)(pcVar18 + uVar8)) = bVar20;
                    }
                    else {
                      iVar3 = 8 - (uVar19 + uVar21);
                      while (bVar22 = pcVar16 != (char *)0x0, pcVar16 = pcVar16 + -1, bVar22) {
                        *(byte *)((long)piVar7 + (long)(pcVar18 + uVar8)) =
                             *(byte *)((long)piVar7 + (long)(pcVar18 + uVar8)) |
                             (byte)(1 << ((byte)iVar3 & 0x1f));
                        iVar3 = iVar3 + 1;
                      }
                      pcVar16 = (char *)0x0;
                    }
                    if (uVar13 < uVar21) goto LAB_00188843;
                  }
                  uVar8 = 0;
                  do {
                    if ((ulong)local_48 >> 3 == uVar8) {
                      lVar12 = 0;
                      goto LAB_001888b1;
                    }
                    pcVar16 = pcVar18 + uVar8;
                    uVar8 = uVar8 + 1;
                  } while (*(char *)((long)piVar7 + (long)pcVar16) == -1);
                  goto LAB_001888ca;
                }
                bVar20 = *(byte *)local_58 | 4;
                goto LAB_001888d7;
              }
              local_58 = pmVar14;
              iVar4 = ssl_hs_is_proper_fragment(ssl);
              *(byte *)local_58 = bVar20 & 0xfc | (char)iVar4 * '\x02';
              if ((char *)0x400 < pcVar18) goto LAB_00187b80;
              uVar8 = (local_40->buffering).total_bytes_buffered;
              if (0x8000 < uVar8) {
                iVar3 = 0x113e;
                goto LAB_00188990;
              }
              pcVar16 = pcVar18;
              if (iVar4 != 0) {
                pcVar16 = pcVar18 + ((((ulong)local_48 >> 3) + 1) -
                                    (ulong)(((ulong)local_48 & 7) == 0));
              }
              if (pcVar16 <= (char *)(0x8000 - uVar8)) {
LAB_0018867e:
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x1176,"initialize reassembly, total length = %zu",local_48,
                           in_stack_ffffffffffffff48);
                piVar7 = (int *)calloc(1,(size_t)pcVar16);
                local_58->data = (uchar *)piVar7;
                if (piVar7 == (int *)0x0) {
                  iVar3 = -0x7f00;
                  local_50 = (uchar *)((ulong)local_50 & 0xffffffff00000000);
                  goto LAB_00187b80;
                }
                local_58->data_len = (size_t)pcVar16;
                piVar1 = (int *)ssl->in_msg;
                *piVar7 = *piVar1;
                *(short *)(piVar7 + 1) = (short)piVar1[1];
                *(undefined2 *)((long)piVar7 + 6) = 0;
                *(undefined1 *)(piVar7 + 2) = 0;
                *(undefined2 *)((long)piVar7 + 9) = *(undefined2 *)((long)piVar7 + 1);
                *(undefined1 *)((long)piVar7 + 0xb) = *(undefined1 *)((long)piVar7 + 3);
                bVar20 = *(byte *)local_58 | 1;
                *(byte *)local_58 = bVar20;
                (local_40->buffering).total_bytes_buffered =
                     (size_t)(pcVar16 + (local_40->buffering).total_bytes_buffered);
                pmVar14 = local_58;
                goto LAB_0018871d;
              }
              if (uVar10 == uVar19) {
                in_stack_ffffffffffffff48 = (char *)0x8000;
                local_38 = pcVar16;
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x115d,
                           "Buffering of future message of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- attempt to make space by freeing buffered future messages\n"
                           ,local_48,0x8000,uVar8);
                pmVar17 = ssl->handshake;
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x10d4,"Attempt to free buffered messages to have %u bytes available",
                           local_38);
                ssl_free_buffered_record(ssl);
                if ((char *)(0x8000 - (pmVar17->buffering).total_bytes_buffered) < local_38) {
                  uVar19 = 3;
                  do {
                    if ((int)uVar19 < 0) {
                      in_stack_ffffffffffffff50 = 0;
                      local_50 = (uchar *)((ulong)local_50 & 0xffffffff00000000);
                      in_stack_ffffffffffffff48 = local_38;
                      mbedtls_debug_print_msg
                                (ssl,2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                 ,0x116d,
                                 "Reassembly of next message of size %zu (%zu with bitmap) would exceed the compile-time limit %zu (already %zu bytes buffered) -- fail\n"
                                 ,local_48,local_38,0x8000,
                                 (local_40->buffering).total_bytes_buffered);
                      iVar3 = -0x6a00;
                      goto LAB_00187b80;
                    }
                    mbedtls_debug_print_msg
                              (ssl,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                               ,0x10e8,
                               "Free buffering slot %d to make space for reassembly of next handshake message"
                               ,(ulong)uVar19,in_stack_ffffffffffffff48,uVar8);
                    ssl_buffering_free_slot(ssl,(uint8_t)uVar19);
                    uVar19 = uVar19 - 1;
                  } while ((char *)(0x8000 - (pmVar17->buffering).total_bytes_buffered) < local_38);
                  mbedtls_debug_print_msg
                            (ssl,2,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                             ,0x10ef,"Enough space available after freeing buffered HS messages");
                  pcVar16 = local_38;
                  in_stack_ffffffffffffff50 = uVar8;
                }
                else {
                  mbedtls_debug_print_msg
                            (ssl,2,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                             ,0x10dc,"Enough space available after freeing future epoch record");
                  pcVar16 = local_38;
                  in_stack_ffffffffffffff50 = uVar8;
                }
                goto LAB_0018867e;
              }
              in_stack_ffffffffffffff48 = (char *)0x8000;
              iVar4 = 0x1152;
              pcVar16 = 
              "Buffering of future message of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- ignore\n"
              ;
              pcVar18 = local_48;
              in_stack_ffffffffffffff50 = uVar8;
              goto LAB_0018890d;
            }
            local_50 = (uchar *)CONCAT44(local_50._4_4_,(int)CONCAT71((int7)((ulong)uVar11 >> 8),1))
            ;
            iVar3 = 0;
            if (ssl->in_msgtype == 0x14) {
              iVar3 = 0;
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1105,"Remember CCS message");
              (local_40->buffering).seen_ccs = '\x01';
            }
            goto LAB_00187b80;
          }
        }
      }
      if (ssl->in_offt != (uchar *)0x0) goto LAB_00187961;
      ssl->in_msglen = 0;
LAB_00187a19:
      if (((ssl->conf->transport == '\x01') && (ssl->in_left <= ssl->next_record_offset)) &&
         (pmVar17 = ssl->handshake, pmVar17 != (mbedtls_ssl_handshake_params *)0x0)) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x107d,"=> ssl_load_buffered_message");
        if ((ssl->state == 10) || (ssl->state == 0xc)) {
          if ((pmVar17->buffering).seen_ccs != '\0') {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1089,"Injecting buffered CCS message");
            ssl->in_msgtype = 0x14;
            ssl->in_msglen = 1;
            *ssl->in_msg = '\x01';
            ssl->in_left = 0;
            ssl->next_record_offset = 0;
            (pmVar17->buffering).seen_ccs = '\0';
LAB_00187ae2:
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x10c9,"<= ssl_load_buffered_message");
            goto LAB_0018796f;
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x1084,"CCS not seen in the current flight");
LAB_00187dc8:
          iVar3 = 2;
          iVar4 = 0x10c9;
          pcVar18 = "<= ssl_load_buffered_message";
        }
        else {
          iVar4 = 1;
          for (lVar12 = 0; lVar12 != 0x48; lVar12 = lVar12 + 0x18) {
            bVar20 = (&(pmVar17->buffering).hs[1].field_0x0)[lVar12];
            if ((bVar20 & 1) != 0) {
              in_stack_ffffffffffffff48 = "fully";
              if ((bVar20 & 4) == 0) {
                in_stack_ffffffffffffff48 = "partially";
              }
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x109f,"Future message with sequence number %u %s buffered.",
                         (ulong)(pmVar17->in_msg_seq + iVar4),in_stack_ffffffffffffff48);
            }
            iVar4 = iVar4 + 1;
          }
          if ((~*(byte *)(pmVar17->buffering).hs & 5) != 0) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x10c2,"Next handshake message %u not or only partially bufffered",
                       (ulong)pmVar17->in_msg_seq);
            goto LAB_00187dc8;
          }
          puVar6 = (pmVar17->buffering).hs[0].data;
          uVar8 = (ulong)puVar6[3] | (ulong)((uint)puVar6[2] << 8 | (uint)puVar6[1] << 0x10);
          if (uVar8 < 0x3f5) {
            pcVar18 = (char *)(uVar8 + 0xc);
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x10b5,"Next handshake message has been buffered - load");
            in_stack_ffffffffffffff48 = pcVar18;
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x10b7,"Buffered handshake message (incl. header)",
                       (pmVar17->buffering).hs[0].data,(size_t)pcVar18);
            ssl->in_msgtype = 0x16;
            ssl->in_hslen = (size_t)pcVar18;
            ssl->in_msglen = (size_t)pcVar18;
            memcpy(ssl->in_msg,(pmVar17->buffering).hs[0].data,(size_t)pcVar18);
            goto LAB_00187ae2;
          }
          iVar4 = 0x10b1;
          pcVar18 = "should never happen";
        }
        mbedtls_debug_print_msg
                  (ssl,iVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,iVar4,pcVar18);
      }
      pmVar17 = ssl->handshake;
      uVar9 = ssl->conf->transport;
      if (pmVar17 == (mbedtls_ssl_handshake_params *)0x0 || uVar9 != '\x01') {
LAB_00187f10:
        sVar15 = 5;
        if (uVar9 == '\x01') goto LAB_00187f18;
      }
      else {
        puVar6 = (pmVar17->buffering).future_record.data;
        if ((puVar6 != (uchar *)0x0) && (ssl->in_left <= ssl->next_record_offset)) {
          local_50 = (uchar *)(pmVar17->buffering).future_record.len;
          uVar19 = (pmVar17->buffering).future_record.epoch;
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x124e,"=> ssl_load_buffered_record");
          if (uVar19 == ssl->in_epoch) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1255,"Found buffered record from current epoch - load");
            puVar2 = local_50;
            if (ssl->in_buf + (0x42d - (long)ssl->in_hdr) < local_50) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1259,"should never happen");
              iVar3 = -0x6c00;
              break;
            }
            memcpy(ssl->in_hdr,puVar6,(size_t)local_50);
            ssl->in_left = (size_t)puVar2;
            ssl->next_record_offset = 0;
            ssl_free_buffered_record(ssl);
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1251,"Buffered record not from current epoch.");
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x1264,"<= ssl_load_buffered_record");
          uVar9 = ssl->conf->transport;
          goto LAB_00187f10;
        }
LAB_00187f18:
        sVar15 = 0xd;
      }
      iVar3 = mbedtls_ssl_fetch_input(ssl,sVar15);
      if (iVar3 != 0) {
        iVar4 = 0x12bc;
LAB_00187f3f:
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,iVar4,"mbedtls_ssl_fetch_input",iVar3);
        goto LAB_00187f4e;
      }
      iVar3 = ssl_parse_record_header(ssl,ssl->in_hdr,ssl->in_left,&local_88);
      uVar9 = ssl->conf->transport;
      if (iVar3 != 0) {
        if (uVar9 != '\x01') goto LAB_00187f4e;
        if (iVar3 == -0x6700) {
LAB_001885f5:
          ssl->next_record_offset = local_88.buf_len;
          iVar3 = 0x12e8;
          pcVar18 = "discarding unexpected record (header)";
        }
        else {
          if (iVar3 == -0x6480) {
            pmVar17 = ssl->handshake;
            if (((pmVar17 != (mbedtls_ssl_handshake_params *)0x0) && (local_88.type == 0x16)) &&
               ((pmVar17->buffering).future_record.data == (uchar *)0x0)) {
              uVar8 = (pmVar17->buffering).total_bytes_buffered;
              if ((char *)(0x8000 - uVar8) < local_88.buf_len) {
                in_stack_ffffffffffffff48 = (char *)0x0;
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x1286,
                           "Buffering of future epoch record of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- ignore\n"
                           ,local_88.buf_len,0x8000,uVar8);
                in_stack_ffffffffffffff50 = uVar8;
              }
              else {
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x128c,"Buffer record from epoch %u",(ulong)(ssl->in_epoch + 1));
                in_stack_ffffffffffffff48 = (char *)local_88.buf_len;
                mbedtls_debug_print_buf
                          (ssl,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x128d,"Buffered record",local_88.buf,local_88.buf_len);
                sVar15 = local_88.buf_len;
                (pmVar17->buffering).future_record.epoch = ssl->in_epoch + 1;
                (pmVar17->buffering).future_record.len = local_88.buf_len;
                puVar6 = (uchar *)calloc(1,local_88.buf_len);
                (pmVar17->buffering).future_record.data = puVar6;
                if (puVar6 != (uchar *)0x0) {
                  memcpy(puVar6,local_88.buf,sVar15);
                  (pmVar17->buffering).total_bytes_buffered =
                       (size_t)(sVar15 + (pmVar17->buffering).total_bytes_buffered);
                }
              }
            }
            goto LAB_001885f5;
          }
          ssl->next_record_offset = 0;
          ssl->in_left = 0;
          iVar3 = 0x12ef;
          pcVar18 = "discarding invalid record (header)";
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,iVar3,pcVar18);
        goto LAB_001878d3;
      }
      if (uVar9 == '\x01') {
        ssl->next_record_offset = local_88.buf_len;
        if (local_88.buf_len < (char *)ssl->in_left) {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x1300,"more than one record within datagram");
        }
      }
      else {
        iVar3 = mbedtls_ssl_fetch_input(ssl,local_88.buf_len);
        if (iVar3 != 0) {
          iVar4 = 0x130a;
          goto LAB_00187f3f;
        }
        ssl->in_left = 0;
      }
      in_stack_ffffffffffffff48 = (char *)local_88.buf_len;
      mbedtls_debug_print_buf
                (ssl,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xf89,"input record from network",local_88.buf,local_88.buf_len);
      uVar9 = local_88.type;
      if (ssl->transform_in == (mbedtls_ssl_transform *)0x0) {
        uVar9 = ssl->conf->transport;
LAB_00188120:
        if (uVar9 == '\x01') {
LAB_001881ad:
          mbedtls_ssl_dtls_replay_update(ssl);
        }
        if (local_88.data_len < (char *)0x401) {
          mbedtls_ssl_update_in_pointers(ssl);
          ssl->in_iv = ssl->in_len + 2;
          ssl->in_msgtype = (uint)local_88.type;
          *ssl->in_hdr = local_88.type;
          ssl->in_msg = local_88.buf + local_88.data_offset;
          ssl->in_msglen = local_88.data_len;
          *(ushort *)ssl->in_len = (ushort)local_88.data_len << 8 | (ushort)local_88.data_len >> 8;
          goto LAB_0018796f;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xffe,"bad message length");
LAB_001881df:
        iVar3 = -0x7200;
      }
      else {
        uVar8 = (ulong)local_88.type;
        iVar3 = mbedtls_ssl_decrypt_buf(ssl,ssl->transform_in,&local_88);
        if (iVar3 == 0) {
          if (uVar9 != local_88.type) {
            mbedtls_debug_print_msg
                      (ssl,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0xfae,"record type after decrypt (before %d): %d",uVar8,
                       CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(uint)local_88.type)
                      );
          }
          in_stack_ffffffffffffff48 = (char *)local_88.data_len;
          mbedtls_debug_print_buf
                    (ssl,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0xfb2,"input payload after decrypt",local_88.buf + local_88.data_offset,
                     local_88.data_len);
          if ((char *)local_88.data_len == (char *)0x0) {
            if ((ssl->tls_version != MBEDTLS_SSL_VERSION_TLS1_2) || (local_88.type == 0x17)) {
              iVar3 = ssl->nb_zero;
              ssl->nb_zero = iVar3 + 1;
              if (2 < iVar3) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0xfd4,"received four consecutive empty messages, possible DoS attack");
                iVar3 = -0x7180;
                goto LAB_001881e5;
              }
              goto LAB_001881a0;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0xfc7,"invalid zero-length message type: %d",(ulong)(uint)ssl->in_msgtype);
            goto LAB_001881df;
          }
          ssl->nb_zero = 0;
LAB_001881a0:
          if (ssl->conf->transport == '\x01') goto LAB_001881ad;
          uVar8 = 7;
          do {
            uVar19 = (int)uVar8 + 1;
            uVar9 = ssl->conf->transport;
            if (uVar19 <= (uint)(uVar9 == '\x01') * 2) goto LAB_001884e8;
            puVar6 = ssl->in_ctr + uVar8;
            *puVar6 = *puVar6 + '\x01';
            uVar8 = (ulong)((int)uVar8 - 1);
          } while (*puVar6 == '\0');
          uVar9 = ssl->conf->transport;
LAB_001884e8:
          if ((uint)(uVar9 == '\x01') * 2 != uVar19) goto LAB_00188120;
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0xfee,"incoming message counter would wrap");
          iVar3 = -0x6b80;
        }
        else {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0xf9e,"ssl_decrypt_buf",iVar3);
        }
      }
LAB_001881e5:
      if ((iVar3 == -0x7180) && (ssl->conf->transport == '\x01')) {
        if ((ssl->state != 0xb) && (ssl->state != 0xd)) {
          uVar19 = ssl->conf->badmac_limit;
          if ((uVar19 == 0) ||
             (uVar13 = ssl->badmac_seen + 1, ssl->badmac_seen = uVar13, uVar13 < uVar19)) {
            ssl->next_record_offset = 0;
            ssl->in_left = 0;
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1335,"discarding invalid record (mac)");
            goto LAB_001878d3;
          }
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x132b,"too many records with bad MAC");
        }
        iVar3 = -0x7180;
        break;
      }
LAB_00187f4e:
    } while (iVar3 == -0x6580);
    pcVar18 = "ssl_get_next_record";
    iVar4 = 0x1039;
LAB_00188a95:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,iVar4,pcVar18,iVar3);
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x105e,"reuse previously read message");
    ssl->keep_current_message = 0;
LAB_00187885:
    iVar3 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x1062,"<= read record");
  }
  return iVar3;
  while (iVar3 = (int)lVar12, lVar12 = lVar12 + -1,
        (*(byte *)((long)piVar7 + (long)(pcVar18 + ((ulong)local_48 >> 3))) >> (iVar3 + 7U & 0x1f) &
        1) != 0) {
LAB_001888b1:
    if (-lVar12 == (ulong)((uint)local_48 & 7)) {
      bVar20 = 4;
      goto LAB_001888d0;
    }
  }
LAB_001888ca:
  bVar20 = 0;
LAB_001888d0:
  bVar20 = *(byte *)local_58 & 0xfb | bVar20;
LAB_001888d7:
  *(byte *)local_58 = bVar20;
  pcVar18 = anon_var_dwarf_307b52 + 9;
  if ((bVar20 & 4) == 0) {
    pcVar18 = "not yet ";
  }
  iVar4 = 0x11ad;
  pcVar16 = "message %scomplete";
LAB_0018890d:
  iVar3 = 0;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,iVar4,pcVar16,pcVar18,in_stack_ffffffffffffff48);
LAB_00187b80:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x11ba,"<= ssl_buffer_message");
  if ((char)local_50 == '\0') {
    return iVar3;
  }
  goto LAB_001878d3;
}

Assistant:

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl,
                            unsigned update_hs_digest)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> read record"));

    if (ssl->keep_current_message == 0) {
        do {

            ret = ssl_consume_current_message(ssl);
            if (ret != 0) {
                return ret;
            }

            if (ssl_record_is_in_progress(ssl) == 0) {
                int dtls_have_buffered = 0;
#if defined(MBEDTLS_SSL_PROTO_DTLS)

                /* We only check for buffered messages if the
                 * current datagram is fully consumed. */
                if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
                    ssl_next_record_is_in_datagram(ssl) == 0) {
                    if (ssl_load_buffered_message(ssl) == 0) {
                        dtls_have_buffered = 1;
                    }
                }

#endif /* MBEDTLS_SSL_PROTO_DTLS */
                if (dtls_have_buffered == 0) {
                    ret = ssl_get_next_record(ssl);
                    if (ret == MBEDTLS_ERR_SSL_CONTINUE_PROCESSING) {
                        continue;
                    }

                    if (ret != 0) {
                        MBEDTLS_SSL_DEBUG_RET(1, ("ssl_get_next_record"), ret);
                        return ret;
                    }
                }
            }

            ret = mbedtls_ssl_handle_message_type(ssl);

#if defined(MBEDTLS_SSL_PROTO_DTLS)
            if (ret == MBEDTLS_ERR_SSL_EARLY_MESSAGE) {
                /* Buffer future message */
                ret = ssl_buffer_message(ssl);
                if (ret != 0) {
                    return ret;
                }

                ret = MBEDTLS_ERR_SSL_CONTINUE_PROCESSING;
            }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        } while (MBEDTLS_ERR_SSL_NON_FATAL           == ret  ||
                 MBEDTLS_ERR_SSL_CONTINUE_PROCESSING == ret);

        if (0 != ret) {
            MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_handle_message_type"), ret);
            return ret;
        }

        if (ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
            update_hs_digest == 1) {
            ret = mbedtls_ssl_update_handshake_status(ssl);
            if (0 != ret) {
                MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_update_handshake_status"), ret);
                return ret;
            }
        }
    } else {
        MBEDTLS_SSL_DEBUG_MSG(2, ("reuse previously read message"));
        ssl->keep_current_message = 0;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= read record"));

    return 0;
}